

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void anon_unknown.dwarf_22460c::TestLShift1(BIGNUMFileTest *t,BN_CTX *ctx)

{
  bool bVar1;
  BIGNUM *pBVar2;
  char *pcVar3;
  pointer pbVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  pointer pbVar7;
  BIGNUM *d;
  pointer pbVar8;
  char *in_R9;
  AssertHelper local_770;
  Message local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_730;
  Message local_728;
  int local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__19;
  Message local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_6c8;
  Message local_6c0;
  int local_6b4;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__18;
  Message local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_660;
  Message local_658;
  int local_64c;
  undefined1 local_648 [8];
  AssertionResult gtest_ar__17;
  Message local_630;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_5f8;
  Message local_5f0;
  int local_5e4;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_5b0;
  Message local_5a8;
  int local_59c;
  undefined1 local_598 [8];
  AssertionResult gtest_ar__15;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_548;
  Message local_540;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__14;
  Message local_518;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_4e0;
  Message local_4d8;
  int local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__13;
  Message local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_478;
  Message local_470;
  int local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__12;
  Message local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_410;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__11;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_3a8;
  Message local_3a0;
  int local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__10;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_3;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_320;
  Message local_318;
  int local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__9;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2b8;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__8;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar;
  AssertHelper local_250;
  Message local_248;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_208;
  Message local_200;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<BIGNUM> remainder;
  UniquePtr<BIGNUM> two;
  UniquePtr<BIGNUM> ret;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  string local_80;
  AssertHelper local_60;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> zero;
  undefined1 local_28 [8];
  UniquePtr<BIGNUM> lshift1;
  UniquePtr<BIGNUM> a;
  BN_CTX *ctx_local;
  BIGNUMFileTest *t_local;
  
  BIGNUMFileTest::GetBIGNUM((BIGNUMFileTest *)&lshift1,(char *)t);
  BIGNUMFileTest::GetBIGNUM((BIGNUMFileTest *)local_28,(char *)t);
  pBVar2 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_50,&lshift1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_50,(AssertionResult *)(anon_var_dwarf_ac099 + 0xc),
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xfc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_98,
               (unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_98,(AssertionResult *)"lshift1",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0xfd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d8,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&ret,(internal *)local_d8,(AssertionResult *)0x81d092,"false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xfe,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&ret);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        BN_zero(pbVar4);
        pBVar2 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&two,(pointer)pBVar2);
        pBVar2 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&remainder,(pointer)pBVar2);
        pBVar2 = BN_new();
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (pointer)pBVar2);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_130,&two,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar1) {
          testing::Message::Message(&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_130,
                     (AssertionResult *)0x857fd4,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x103,pcVar3);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_138);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_170,&remainder,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar1) {
            testing::Message::Message(&local_178);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_170,
                       (AssertionResult *)0x84c956,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x104,pcVar3);
            testing::internal::AssertHelper::operator=(&local_180,&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_178);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1b0,
                       (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1b0,
                         (AssertionResult *)"remainder","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x105,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pBVar2 = (BIGNUM *)
                       std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&remainder);
              local_1f4 = BN_set_word(pBVar2,2);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1f0,&local_1f4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_200);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1f0,
                           (AssertionResult *)"BN_set_word(two.get(), 2)","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_208,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x107,pcVar3);
                testing::internal::AssertHelper::operator=(&local_208,&local_200);
                testing::internal::AssertHelper::~AssertHelper(&local_208);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_200);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pBVar2 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                pBVar5 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                pBVar6 = (BIGNUM *)
                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                local_23c = BN_add(pBVar2,pBVar5,pBVar6);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_238,&local_23c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_238);
                if (!bVar1) {
                  testing::Message::Message(&local_248);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar.message_,(internal *)local_238,
                             (AssertionResult *)"BN_add(ret.get(), a.get(), a.get())","false","true"
                             ,in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_250,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x108,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_250,&local_248);
                  testing::internal::AssertHelper::~AssertHelper(&local_250);
                  std::__cxx11::string::~string((string *)&gtest_ar.message_);
                  testing::Message::~Message(&local_248);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28);
                  pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                  AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_280,"\"A + A\"",
                                     "lshift1.get()","ret.get()","A + A",pbVar4,pbVar7);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_280);
                  if (!bVar1) {
                    testing::Message::Message(&local_288);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x109,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_288);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_288);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  pBVar2 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                  pBVar5 = (BIGNUM *)
                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                  pBVar6 = (BIGNUM *)
                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&remainder);
                  local_2a4 = BN_mul(pBVar2,pBVar5,pBVar6,(BN_CTX *)ctx);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_2a0,&local_2a4,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2a0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_1.message_,(internal *)local_2a0,
                               (AssertionResult *)"BN_mul(ret.get(), a.get(), two.get(), ctx)",
                               "false","true",(char *)pbVar4);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x10b,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
                    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                    testing::Message::~Message(&local_2b0);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28);
                    pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                    AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_2e8,"\"A * 2\"",
                                       "lshift1.get()","ret.get()","A * 2",pbVar4,pbVar7);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2f0);
                      pcVar3 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2e8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x10c,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar__9.message_,&local_2f0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar__9.message_);
                      testing::Message::~Message(&local_2f0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
                    pBVar2 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                    pBVar5 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__3.message_);
                    pBVar6 = (BIGNUM *)
                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28);
                    d = (BIGNUM *)
                        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&remainder);
                    local_30c = BN_div(pBVar2,pBVar5,pBVar6,d,(BN_CTX *)ctx);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_308,&local_30c,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_308);
                    if (!bVar1) {
                      testing::Message::Message(&local_318);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_2.message_,(internal *)local_308,
                                 (AssertionResult *)
                                 "BN_div(ret.get(), remainder.get(), lshift1.get(), two.get(), ctx)"
                                 ,"false","true",(char *)pbVar4);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_320,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x10f,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_320,&local_318);
                      testing::internal::AssertHelper::~AssertHelper(&local_320);
                      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                      testing::Message::~Message(&local_318);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                      pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                      AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_350,"\"LShift1 / 2\"",
                                         "a.get()","ret.get()","LShift1 / 2",pbVar4,pbVar7);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_350);
                      if (!bVar1) {
                        testing::Message::Message(&local_358);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_350);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x110,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_3.message_,&local_358);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_3.message_);
                        testing::Message::~Message(&local_358);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
                      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
                      AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_370,"\"LShift1 % 2\"",
                                         "zero.get()","remainder.get()","LShift1 % 2",pbVar4,pbVar7)
                      ;
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_370);
                      if (!bVar1) {
                        testing::Message::Message(&local_378);
                        pcVar3 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_370);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__10.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x111,pcVar3);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__10.message_,&local_378);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__10.message_);
                        testing::Message::~Message(&local_378);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
                      pBVar2 = (BIGNUM *)
                               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                      pBVar5 = (BIGNUM *)
                               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                      local_394 = BN_lshift1(pBVar2,pBVar5);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_390,&local_394,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_390);
                      if (!bVar1) {
                        testing::Message::Message(&local_3a0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_4.message_,(internal *)local_390,
                                   (AssertionResult *)"BN_lshift1(ret.get(), a.get())","false",
                                   "true",(char *)pbVar4);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3a8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x113,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
                        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
                        std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                        testing::Message::~Message(&local_3a0);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                            local_28);
                        pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                        AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_3d8,"\"A << 1\"",
                                           "lshift1.get()","ret.get()","A << 1",pbVar4,pbVar7);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3d8);
                        if (!bVar1) {
                          testing::Message::Message(&local_3e0);
                          pcVar3 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_3d8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x114,pcVar3);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__11.message_,&local_3e0);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__11.message_);
                          testing::Message::~Message(&local_3e0);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
                        pBVar2 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                        pBVar5 = (BIGNUM *)
                                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&lshift1);
                        local_3fc = BN_lshift(pBVar2,pBVar5,1);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_3f8,&local_3fc,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3f8);
                        if (!bVar1) {
                          testing::Message::Message(&local_408);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_5.message_,(internal *)local_3f8,
                                     (AssertionResult *)"BN_lshift(ret.get(), a.get(), 1)","false",
                                     "true",(char *)pbVar4);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_410,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x116,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_410,&local_408);
                          testing::internal::AssertHelper::~AssertHelper(&local_410);
                          std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
                          testing::Message::~Message(&local_408);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              local_28);
                          pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                          AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_440,
                                             "\"A << 1 (variable shift)\"","lshift1.get()",
                                             "ret.get()","A << 1 (variable shift)",pbVar4,pbVar7);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_440);
                          if (!bVar1) {
                            testing::Message::Message(&local_448);
                            pcVar3 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_440);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x117,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__12.message_,&local_448);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__12.message_);
                            testing::Message::~Message(&local_448);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
                          pBVar2 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                          pBVar5 = (BIGNUM *)
                                   std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                              local_28);
                          local_464 = BN_rshift1(pBVar2,pBVar5);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_460,&local_464,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_460);
                          if (!bVar1) {
                            testing::Message::Message(&local_470);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_6.message_,(internal *)local_460,
                                       (AssertionResult *)"BN_rshift1(ret.get(), lshift1.get())",
                                       "false","true",(char *)pbVar4);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_478,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0x119,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_478,&local_470);
                            testing::internal::AssertHelper::~AssertHelper(&local_478);
                            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
                            testing::Message::~Message(&local_470);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               (&lshift1);
                            pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                            AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_4a8,
                                               "\"LShift >> 1\"","a.get()","ret.get()","LShift >> 1"
                                               ,pbVar4,pbVar7);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_4a8);
                            if (!bVar1) {
                              testing::Message::Message(&local_4b0);
                              pcVar3 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_4a8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                         ,0x11a,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar__13.message_,&local_4b0);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar__13.message_);
                              testing::Message::~Message(&local_4b0);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8)
                            ;
                            pBVar2 = (BIGNUM *)
                                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&two);
                            pBVar5 = (BIGNUM *)
                                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                local_28);
                            local_4cc = BN_rshift(pBVar2,pBVar5,1);
                            testing::AssertionResult::AssertionResult<int>
                                      ((AssertionResult *)local_4c8,&local_4cc,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_4c8);
                            if (!bVar1) {
                              testing::Message::Message(&local_4d8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar_7.message_,(internal *)local_4c8,
                                         (AssertionResult *)"BN_rshift(ret.get(), lshift1.get(), 1)"
                                         ,"false","true",(char *)pbVar4);
                              pcVar3 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_4e0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                         ,0x11c,pcVar3);
                              testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
                              testing::internal::AssertHelper::~AssertHelper(&local_4e0);
                              std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                              testing::Message::~Message(&local_4d8);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                 (&lshift1);
                              pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                 (&two);
                              AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_510,
                                                 "\"LShift >> 1 (variable shift)\"","a.get()",
                                                 "ret.get()","LShift >> 1 (variable shift)",pbVar4,
                                                 pbVar7);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_510);
                              if (!bVar1) {
                                testing::Message::Message(&local_518);
                                pcVar3 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_510);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__14.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0x11d,pcVar3);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__14.message_,&local_518);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__14.message_);
                                testing::Message::~Message(&local_518);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_510);
                              pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                 (&two);
                              pbVar8 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  local_28);
                              local_534 = bn_rshift_secret_shift(pbVar7,pbVar8,1,ctx);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_530,&local_534,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_530);
                              if (!bVar1) {
                                testing::Message::Message(&local_540);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar_8.message_,(internal *)local_530,
                                           (AssertionResult *)
                                           "bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx)"
                                           ,"false","true",(char *)pbVar4);
                                pcVar3 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_548,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                           ,0x11f,pcVar3);
                                testing::internal::AssertHelper::operator=(&local_548,&local_540);
                                testing::internal::AssertHelper::~AssertHelper(&local_548);
                                std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
                                testing::Message::~Message(&local_540);
                              }
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_530);
                              if (gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   (&lshift1);
                                pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   (&two);
                                AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_578,
                                                   "\"LShift >> 1 (secret shift)\"","a.get()",
                                                   "ret.get()","LShift >> 1 (secret shift)",pbVar4,
                                                   pbVar7);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_578);
                                if (!bVar1) {
                                  testing::Message::Message(&local_580);
                                  pcVar3 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_578);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure
                                             ,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0x120,pcVar3);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar__15.message_,&local_580);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar__15.message_);
                                  testing::Message::~Message(&local_580);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_578);
                                pBVar2 = (BIGNUM *)
                                         std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                   ((unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                     *)local_28);
                                local_59c = BN_set_bit(pBVar2,0);
                                testing::AssertionResult::AssertionResult<int>
                                          ((AssertionResult *)local_598,&local_59c,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_598);
                                if (!bVar1) {
                                  testing::Message::Message(&local_5a8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar__16.message_,(internal *)local_598,
                                             (AssertionResult *)"BN_set_bit(lshift1.get(), 0)",
                                             "false","true",(char *)pbVar4);
                                  pcVar3 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_5b0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                             ,0x123,pcVar3);
                                  testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_5b0);
                                  std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                                  testing::Message::~Message(&local_5a8);
                                }
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_598);
                                if (gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  pBVar2 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     (&two);
                                  pBVar5 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     ((
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  local_28);
                                  pBVar6 = (BIGNUM *)
                                           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                                                     (&remainder);
                                  local_5e4 = BN_div(pBVar2,(BIGNUM *)0x0,pBVar5,pBVar6,
                                                     (BN_CTX *)ctx);
                                  testing::AssertionResult::AssertionResult<int>
                                            ((AssertionResult *)local_5e0,&local_5e4,(type *)0x0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_5e0);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_5f0);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)&gtest_ar_9.message_,(internal *)local_5e0,
                                               (AssertionResult *)
                                               "BN_div(ret.get(), nullptr , lshift1.get(), two.get(), ctx)"
                                               ,"false","true",(char *)pbVar4);
                                    pcVar3 = (char *)std::__cxx11::string::c_str();
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_5f8,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                               ,0x125,pcVar3);
                                    testing::internal::AssertHelper::operator=
                                              (&local_5f8,&local_5f0);
                                    testing::internal::AssertHelper::~AssertHelper(&local_5f8);
                                    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
                                    testing::Message::~Message(&local_5f0);
                                  }
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar__1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_5e0);
                                  if (gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get(&lshift1);
                                    pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get(&two);
                                    AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_628,
                                                       "\"(LShift1 | 1) / 2\"","a.get()","ret.get()"
                                                       ,"(LShift1 | 1) / 2",pbVar4,pbVar7);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_628);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_630);
                                      pcVar3 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_628);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar__17.message_,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0x126,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar__17.message_,&local_630);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar__17.message_);
                                      testing::Message::~Message(&local_630);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_628);
                                    pBVar2 = (BIGNUM *)
                                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get(&two);
                                    pBVar5 = (BIGNUM *)
                                             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                             get((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                 local_28);
                                    local_64c = BN_rshift1(pBVar2,pBVar5);
                                    testing::AssertionResult::AssertionResult<int>
                                              ((AssertionResult *)local_648,&local_64c,(type *)0x0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_648);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_658);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)&gtest_ar_10.message_,
                                                 (internal *)local_648,
                                                 (AssertionResult *)
                                                 "BN_rshift1(ret.get(), lshift1.get())","false",
                                                 "true",(char *)pbVar4);
                                      pcVar3 = (char *)std::__cxx11::string::c_str();
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_660,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                 ,0x128,pcVar3);
                                      testing::internal::AssertHelper::operator=
                                                (&local_660,&local_658);
                                      testing::internal::AssertHelper::~AssertHelper(&local_660);
                                      std::__cxx11::string::~string((string *)&gtest_ar_10.message_)
                                      ;
                                      testing::Message::~Message(&local_658);
                                    }
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_648);
                                    if (gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get(&lshift1);
                                      pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get(&two);
                                      AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_690,
                                                         "\"(LShift | 1) >> 1\"","a.get()",
                                                         "ret.get()","(LShift | 1) >> 1",pbVar4,
                                                         pbVar7);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_690);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_698);
                                        pcVar3 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_690);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar__18.message_,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x129,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar__18.message_,&local_698
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar__18.message_);
                                        testing::Message::~Message(&local_698);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_690);
                                      pBVar2 = (BIGNUM *)
                                               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get(&two);
                                      pBVar5 = (BIGNUM *)
                                               std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                               get((unique_ptr<bignum_st,_bssl::internal::Deleter> *
                                                   )local_28);
                                      local_6b4 = BN_rshift(pBVar2,pBVar5,1);
                                      testing::AssertionResult::AssertionResult<int>
                                                ((AssertionResult *)local_6b0,&local_6b4,(type *)0x0
                                                );
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_6b0);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_6c0);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)&gtest_ar_11.message_,
                                                   (internal *)local_6b0,
                                                   (AssertionResult *)
                                                   "BN_rshift(ret.get(), lshift1.get(), 1)","false",
                                                   "true",(char *)pbVar4);
                                        pcVar3 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_6c8,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,299,pcVar3);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_6c8,&local_6c0);
                                        testing::internal::AssertHelper::~AssertHelper(&local_6c8);
                                        std::__cxx11::string::~string
                                                  ((string *)&gtest_ar_11.message_);
                                        testing::Message::~Message(&local_6c0);
                                      }
                                      gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_6b0);
                                      if (gtest_ar__1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                 ::get(&lshift1);
                                        pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                 ::get(&two);
                                        AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_6f8,
                                                           "\"(LShift | 1) >> 1 (variable shift)\"",
                                                           "a.get()","ret.get()",
                                                           "(LShift | 1) >> 1 (variable shift)",
                                                           pbVar4,pbVar7);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_6f8);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_700);
                                          pcVar3 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_6f8);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar__19.message_,
                                                     kNonFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x12d,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar__19.message_,
                                                     &local_700);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar__19.message_);
                                          testing::Message::~Message(&local_700);
                                        }
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_6f8);
                                        pbVar7 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                 ::get(&two);
                                        pbVar8 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>
                                                 ::get((
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                                  local_28);
                                        local_71c = bn_rshift_secret_shift(pbVar7,pbVar8,1,ctx);
                                        testing::AssertionResult::AssertionResult<int>
                                                  ((AssertionResult *)local_718,&local_71c,
                                                   (type *)0x0);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_718);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_728);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)&gtest_ar_12.message_,
                                                     (internal *)local_718,
                                                     (AssertionResult *)
                                                                                                          
                                                  "bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx)"
                                                  ,"false","true",(char *)pbVar4);
                                          pcVar3 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_730,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x12f,pcVar3);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_730,&local_728);
                                          testing::internal::AssertHelper::~AssertHelper(&local_730)
                                          ;
                                          std::__cxx11::string::~string
                                                    ((string *)&gtest_ar_12.message_);
                                          testing::Message::~Message(&local_728);
                                        }
                                        gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar__1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_718);
                                        if (gtest_ar__1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          pbVar4 = std::
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                                  get(&lshift1);
                                          pbVar7 = std::
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                                  get(&two);
                                          AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_760,
                                                             "\"(LShift | 1) >> 1 (secret shift)\"",
                                                             "a.get()","ret.get()",
                                                             "(LShift | 1) >> 1 (secret shift)",
                                                             pbVar4,pbVar7);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_760);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_768);
                                            pcVar3 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_760);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_770,kNonFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                                  ,0x130,pcVar3);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_770,&local_768);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_770);
                                            testing::Message::~Message(&local_768);
                                          }
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_760);
                                          gtest_ar__1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ = 0;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&remainder);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&two);
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&lshift1);
  return;
}

Assistant:

static void TestLShift1(BIGNUMFileTest *t, BN_CTX *ctx) {
  bssl::UniquePtr<BIGNUM> a = t->GetBIGNUM("A");
  bssl::UniquePtr<BIGNUM> lshift1 = t->GetBIGNUM("LShift1");
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(lshift1);
  ASSERT_TRUE(zero);

  BN_zero(zero.get());

  bssl::UniquePtr<BIGNUM> ret(BN_new()), two(BN_new()), remainder(BN_new());
  ASSERT_TRUE(ret);
  ASSERT_TRUE(two);
  ASSERT_TRUE(remainder);

  ASSERT_TRUE(BN_set_word(two.get(), 2));
  ASSERT_TRUE(BN_add(ret.get(), a.get(), a.get()));
  EXPECT_BIGNUMS_EQUAL("A + A", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_mul(ret.get(), a.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("A * 2", lshift1.get(), ret.get());

  ASSERT_TRUE(
      BN_div(ret.get(), remainder.get(), lshift1.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("LShift1 / 2", a.get(), ret.get());
  EXPECT_BIGNUMS_EQUAL("LShift1 % 2", zero.get(), remainder.get());

  ASSERT_TRUE(BN_lshift1(ret.get(), a.get()));
  EXPECT_BIGNUMS_EQUAL("A << 1", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_lshift(ret.get(), a.get(), 1));
  EXPECT_BIGNUMS_EQUAL("A << 1 (variable shift)", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_rshift1(ret.get(), lshift1.get()));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift(ret.get(), lshift1.get(), 1));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1 (variable shift)", a.get(), ret.get());

  ASSERT_TRUE(bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1 (secret shift)", a.get(), ret.get());

  // Set the LSB to 1 and test rshift1 again.
  ASSERT_TRUE(BN_set_bit(lshift1.get(), 0));
  ASSERT_TRUE(
      BN_div(ret.get(), nullptr /* rem */, lshift1.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("(LShift1 | 1) / 2", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift1(ret.get(), lshift1.get()));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift(ret.get(), lshift1.get(), 1));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1 (variable shift)", a.get(),
                       ret.get());

  ASSERT_TRUE(bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1 (secret shift)", a.get(), ret.get());
}